

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soap_ctrlpt.c
# Opt level: O1

char * get_node_value(IXML_Node *node)

{
  IXML_Node *nodeptr;
  char *pcVar1;
  
  nodeptr = ixmlNode_getFirstChild(node);
  if (nodeptr != (IXML_Node *)0x0) {
    pcVar1 = ixmlNode_getNodeValue(nodeptr);
    return pcVar1;
  }
  return (char *)0x0;
}

Assistant:

static const DOMString get_node_value(IXML_Node *node)
{
	IXML_Node *text_node = NULL;
	const DOMString text_value = NULL;

	text_node = ixmlNode_getFirstChild(node);
	if (text_node == NULL) {
		return NULL;
	}

	text_value = ixmlNode_getNodeValue(text_node);
	return text_value;
}